

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O1

bool cmdline::detail::
     lexical_cast_t<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
     ::cast(string *arg)

{
  istream *piVar1;
  undefined8 *puVar2;
  bool ret;
  istringstream ss;
  undefined1 local_189;
  long local_188 [4];
  byte abStack_168 [88];
  ios_base local_110 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_188,(string *)arg,_S_in);
  piVar1 = std::istream::_M_extract<bool>((bool *)local_188);
  if ((((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) &&
     ((abStack_168[*(long *)(local_188[0] + -0x18)] & 2) != 0)) {
    std::__cxx11::istringstream::~istringstream((istringstream *)local_188);
    std::ios_base::~ios_base(local_110);
    return (bool)local_189;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = vsnprintf;
  __cxa_throw(puVar2,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

static Target cast(const std::string &arg)
			{
				Target ret;
				std::istringstream ss(arg);
				if(!(ss >> ret && ss.eof()))
					throw std::bad_cast();
				return ret;
			}